

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

uint __thiscall
ThreadContext::EnterScriptStart(ThreadContext *this,ScriptEntryExitRecord *record,bool doCleanup)

{
  uint uVar1;
  Recycler *this_00;
  InterruptPoller *pIVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  DWORD DVar6;
  undefined4 *puVar7;
  
  this_00 = this->recycler;
  BVar5 = Memory::Recycler::IsReentrantState(this_00);
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x57e,"(recycler->IsReentrantState())","recycler->IsReentrantState()");
    if (!bVar4) goto LAB_007af465;
    *puVar7 = 0;
  }
  uVar1 = this->callRootLevel;
  this->callRootLevel = uVar1 + 1;
  if (uVar1 == 0) {
    if (this->hasThrownPendingException == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0x586,"(!this->hasThrownPendingException)",
                         "!this->hasThrownPendingException");
      if (!bVar4) goto LAB_007af465;
      *puVar7 = 0;
    }
    pIVar2 = this->interruptPoller;
    if (pIVar2 != (InterruptPoller *)0x0) {
      DVar6 = GetTickCount();
      pIVar2->lastPollTick = DVar6;
      pIVar2->lastResetTick = DVar6;
    }
    Memory::Recycler::SetIsInScript(this_00,true);
    if (doCleanup) {
      Memory::Recycler::EnterIdleDecommit(this_00);
      Memory::Recycler::FinishConcurrent<(Memory::CollectionFlags)270008320>(this_00);
      if (this->threadServiceWrapper == (ThreadServiceWrapper *)0x0) {
        Memory::Recycler::ScheduleNextCollection(this_00);
      }
    }
  }
  PushEntryExitRecord(this,record);
  if (this->isScriptActive == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x5a0,"(!this->IsScriptActive())",
                       "Missing EnterScriptEnd or LeaveScriptStart");
    if (!bVar4) {
LAB_007af465:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  this->isScriptActive = true;
  Memory::Recycler::SetIsScriptActive(this_00,true);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,RunPhase);
  if (bVar4) {
    DVar6 = GetCurrentThreadId();
    Output::Trace(RunPhase,L"%p> EnterScriptStart(%p): Level %d\n",(ulong)DVar6,this,
                  (ulong)this->callRootLevel);
    Output::Flush();
  }
  return uVar1;
}

Assistant:

uint
ThreadContext::EnterScriptStart(Js::ScriptEntryExitRecord * record, bool doCleanup)
{
    Recycler * recycler = this->GetRecycler();
    Assert(recycler->IsReentrantState());
    JS_ETW_INTERNAL(EventWriteJSCRIPT_RUN_START(this,0));

    // Increment the callRootLevel early so that Dispose ran during FinishConcurrent will not close the current scriptContext
    uint oldCallRootLevel = this->callRootLevel++;

    if (oldCallRootLevel == 0)
    {
        Assert(!this->hasThrownPendingException);
        RECORD_TIMESTAMP(lastScriptStartTime);
        InterruptPoller *poller = this->interruptPoller;
        if (poller)
        {
            poller->StartScript();
        }

        recycler->SetIsInScript(true);
        if (doCleanup)
        {
            recycler->EnterIdleDecommit();
#if ENABLE_CONCURRENT_GC
            recycler->FinishConcurrent<FinishConcurrentOnEnterScript>();
#endif
            if (threadServiceWrapper == NULL)
            {
                // Reschedule the next collection at the start of the script.
                recycler->ScheduleNextCollection();
            }
        }
    }

    this->PushEntryExitRecord(record);

    AssertMsg(!this->IsScriptActive(),
              "Missing EnterScriptEnd or LeaveScriptStart");
    this->isScriptActive = true;
    recycler->SetIsScriptActive(true);

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::RunPhase))
    {
        Output::Trace(Js::RunPhase, _u("%p> EnterScriptStart(%p): Level %d\n"), ::GetCurrentThreadId(), this, this->callRootLevel);
        Output::Flush();
    }
#endif

    return oldCallRootLevel;
}